

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O1

void __thiscall
kj::_::AttachmentPromiseNode<capnproto_test::capnp::test::TestInterface::Client>::
~AttachmentPromiseNode
          (AttachmentPromiseNode<capnproto_test::capnp::test::TestInterface::Client> *this)

{
  long *plVar1;
  undefined8 *puVar2;
  PromiseNode *pPVar3;
  Disposer *pDVar4;
  
  AttachmentPromiseNodeBase::dropDependency(&this->super_AttachmentPromiseNodeBase);
  plVar1 = *(long **)&(this->attachment).field_0x10;
  if (plVar1 != (long *)0x0) {
    *(undefined8 *)&(this->attachment).field_0x10 = 0;
    puVar2 = *(undefined8 **)&(this->attachment).field_0x8;
    (**(code **)*puVar2)(puVar2,(long)plVar1 + *(long *)(*plVar1 + -0x10));
  }
  (this->super_AttachmentPromiseNodeBase).super_PromiseNode._vptr_PromiseNode =
       (_func_int **)&PTR_onReady_0064c720;
  pPVar3 = (this->super_AttachmentPromiseNodeBase).dependency.ptr;
  if (pPVar3 != (PromiseNode *)0x0) {
    (this->super_AttachmentPromiseNodeBase).dependency.ptr = (PromiseNode *)0x0;
    pDVar4 = (this->super_AttachmentPromiseNodeBase).dependency.disposer;
    (**pDVar4->_vptr_Disposer)
              (pDVar4,pPVar3->_vptr_PromiseNode[-2] + (long)&pPVar3->_vptr_PromiseNode);
    return;
  }
  return;
}

Assistant:

~AttachmentPromiseNode() noexcept(false) {
    // We need to make sure the dependency is deleted before we delete the attachment because the
    // dependency may be using the attachment.
    dropDependency();
  }